

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O2

offset_t __thiscall
ser::OffsetTable::GetOffset(OffsetTable *this,Savepoint *savepoint,string *fieldName)

{
  const_iterator cVar1;
  offset_t oVar2;
  ostream *poVar3;
  SerializationException *this_00;
  SerializationException exception;
  string local_1b0 [32];
  ostringstream msg;
  
  cVar1 = std::
          _Rb_tree<ser::Savepoint,_std::pair<const_ser::Savepoint,_int>,_std::_Select1st<std::pair<const_ser::Savepoint,_int>_>,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
          ::find(&(this->savepointIndex_)._M_t,savepoint);
  if ((_Rb_tree_header *)cVar1._M_node !=
      &(this->savepointIndex_)._M_t._M_impl.super__Rb_tree_header) {
    oVar2 = GetOffset(this,*(int *)&cVar1._M_node[3]._M_left,fieldName);
    return oVar2;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar3 = std::operator<<((ostream *)&msg,"Error: savepoint ");
  Savepoint::ToString_abi_cxx11_((string *)&exception,savepoint);
  poVar3 = std::operator<<(poVar3,(string *)&exception);
  poVar3 = std::operator<<(poVar3," is not registered in table\n");
  poVar3 = std::operator<<(poVar3,"Retrieving the offset of the field ");
  poVar3 = std::operator<<(poVar3,(string *)fieldName);
  std::operator<<(poVar3," is not possible\n");
  std::__cxx11::string::~string((string *)&exception);
  exception._0_8_ = &PTR__SerializationException_0013e790;
  exception.message_._M_dataplus._M_p = (pointer)&exception.message_.field_2;
  exception.message_._M_string_length = 0;
  exception.message_.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&exception.message_);
  std::__cxx11::string::~string(local_1b0);
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,&exception);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

OffsetTable::offset_t OffsetTable::GetOffset(const Savepoint& savepoint, const std::string& fieldName) const
{
    // Find savepoint ID
    std::map<Savepoint, int>::const_iterator iter = savepointIndex_.find(savepoint);
    if (iter == savepointIndex_.end())
    {
        std::ostringstream msg;
        msg << "Error: savepoint " << savepoint.ToString() << " is not registered in table\n"
            << "Retrieving the offset of the field " << fieldName <<  " is not possible\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    return GetOffset(iter->second, fieldName);
}